

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

Logon * anon_unknown.dwarf_334836::createLogon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  FieldBase local_80;
  
  FIX42::Logon::Logon(__return_storage_ptr__);
  FIX::EncryptMethod::EncryptMethod((EncryptMethod *)&local_80,0);
  FIX42::Logon::set(__return_storage_ptr__,(EncryptMethod *)&local_80);
  FIX::FieldBase::~FieldBase(&local_80);
  FIX::HeartBtInt::HeartBtInt((HeartBtInt *)&local_80,0x1e);
  FIX42::Logon::set(__return_storage_ptr__,(HeartBtInt *)&local_80);
  FIX::FieldBase::~FieldBase(&local_80);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,seq);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_80,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_80,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  return __return_storage_ptr__;
}

Assistant:

FIX42::Logon createLogon(const char *sender, const char *target, int seq) {
  FIX42::Logon logon;
  logon.set(EncryptMethod(0));
  logon.set(HeartBtInt(30));
  fillHeader(logon.getHeader(), sender, target, seq);
  logon.getHeader().setField(BodyLength(logon.bodyLength()));
  logon.getTrailer().setField(CheckSum(logon.checkSum()));
  return logon;
}